

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<char> * __thiscall asl::Array<char>::append(Array<char> *this,Array<char> *b)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = *(int *)(this->_a + -0x10);
  resize(this,*(int *)(b->_a + -0x10) + iVar1);
  for (lVar2 = 0; lVar2 < *(int *)(b->_a + -0x10); lVar2 = lVar2 + 1) {
    this->_a[lVar2 + iVar1] = b->_a[lVar2];
  }
  return this;
}

Assistant:

Array& append(const Array& b)
	{
		int n=length();
		resize(length()+b.length());
		for (int i=0; i<b.length(); i++)
			_a[n+i] = b[i];
		return *this;
	}